

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall QMetaObjectBuilder::addRelatedMetaObject(QMetaObjectBuilder *this,QMetaObject *meta)

{
  qsizetype qVar1;
  
  qVar1 = (this->d->relatedMetaObjects).d.size;
  QList<const_QMetaObject_*>::append(&this->d->relatedMetaObjects,meta);
  return (int)qVar1;
}

Assistant:

int QMetaObjectBuilder::addRelatedMetaObject(const QMetaObject *meta)
{
    Q_ASSERT(meta);
    int index = d->relatedMetaObjects.size();
    d->relatedMetaObjects.append(meta);
    return index;
}